

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86.cpp
# Opt level: O3

int __thiscall
ncnn::GridSample_x86::forward
          (GridSample_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _elempack;
  uint uVar1;
  Mat *src;
  Mat *this_00;
  size_t sVar2;
  int *piVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Option *opt_00;
  long lVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  int *offset_ptr;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  Mat local_e8;
  Mat local_98;
  undefined1 auStack_4a [2];
  float local_48 [6];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _elempack = src->elempack;
  iVar19 = src->c;
  uVar1 = src->dims;
  sVar2 = src->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (float *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8._20_8_ = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  if (src[1].elempack == 1) {
    if (&local_98 != src + 1) {
      piVar3 = src[1].refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_98.data = src[1].data;
      local_98.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_98.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_98.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_98.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_98.elempack = src[1].elempack;
      local_98.allocator = src[1].allocator;
      uVar8 = src[1].dims;
      uVar9 = src[1].w;
      uVar10 = src[1].h;
      uVar11 = src[1].d;
      local_98.c = src[1].c;
      local_98.cstep = src[1].cstep;
      local_98.dims = uVar8;
      local_98.w = uVar9;
      local_98.h = uVar10;
      local_98.d = uVar11;
    }
  }
  else {
    convert_packing(src + 1,&local_98,1,opt);
  }
  if (uVar1 == 3) {
    iVar18 = local_98.h;
    iVar15 = local_98.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar18 = local_98.c;
      iVar15 = local_98.h;
    }
    Mat::create(this_00,iVar15,iVar18,iVar19,sVar2,_elempack,opt->blob_allocator);
    iVar19 = -100;
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_0059846d;
    iVar13 = (this->super_GridSample).sample_type;
    if (iVar13 == 1) {
      Mat::create(&local_e8,iVar15,iVar18,sVar2 * 6,6,opt->workspace_allocator);
      if (((float *)local_e8.data == (float *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_0059846d;
      iVar13 = (this->super_GridSample).padding_mode;
      if (iVar13 == 3) {
        iVar13 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_e8,iVar13);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_e8,iVar13);
        }
      }
      else if (iVar13 == 2) {
        iVar13 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_e8,iVar13);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_e8,iVar13);
        }
      }
      else {
        if (iVar13 != 1) {
          forward();
          goto LAB_0059846d;
        }
        iVar13 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_e8,iVar13);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_e8,iVar13);
        }
      }
      iVar13 = (this->super_GridSample).sample_type;
    }
    if (iVar13 == 2) {
      Mat::create(&local_e8,iVar15,iVar18,1,sVar2,1,opt->workspace_allocator);
      if (((float *)local_e8.data == (float *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_0059846d;
      iVar13 = (this->super_GridSample).padding_mode;
      if (iVar13 == 3) {
        iVar13 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_e8,iVar13);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_e8,iVar13);
        }
      }
      else if (iVar13 == 2) {
        iVar13 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_e8,iVar13);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_e8,iVar13);
        }
      }
      else {
        if (iVar13 != 1) {
          forward();
          goto LAB_0059846d;
        }
        iVar13 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_e8,iVar13);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_e8,iVar13);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_e8,iVar15,iVar18,sVar2 * 0x12,0x12,opt->workspace_allocator);
      if (((float *)local_e8.data == (float *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_0059846d;
      iVar18 = (this->super_GridSample).padding_mode;
      if (iVar18 == 3) {
        iVar19 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_e8,iVar19);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_e8,iVar19);
        }
      }
      else if (iVar18 == 2) {
        iVar19 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_e8,iVar19);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_e8,iVar19);
        }
      }
      else {
        if (iVar18 != 1) {
          forward();
          goto LAB_0059846d;
        }
        iVar19 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_e8,iVar19);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_e8,iVar19);
        }
      }
    }
LAB_00597f06:
    bVar12 = false;
  }
  else {
    if (uVar1 != 4) goto LAB_00597f06;
    iVar18 = local_98.d;
    iVar15 = local_98.w;
    iVar13 = local_98.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar18 = local_98.c;
      iVar15 = local_98.h;
      iVar13 = local_98.d;
    }
    Mat::create(this_00,iVar15,iVar13,iVar18,iVar19,sVar2,_elempack,opt->blob_allocator);
    iVar19 = -100;
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_0059846d;
    iVar14 = (this->super_GridSample).sample_type;
    if (iVar14 == 1) {
      Mat::create(&local_e8,iVar15,iVar13,iVar18,sVar2 * 0xb,0xb,opt->workspace_allocator);
      if (((float *)local_e8.data == (float *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_0059846d;
      iVar14 = (this->super_GridSample).padding_mode;
      if (iVar14 == 3) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_e8,iVar14);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_e8,iVar14);
        }
      }
      else if (iVar14 == 2) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_e8,iVar14);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_e8,iVar14);
        }
      }
      else {
        if (iVar14 != 1) {
          forward();
          goto LAB_0059846d;
        }
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_e8,iVar14);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_e8,iVar14);
        }
      }
      iVar14 = (this->super_GridSample).sample_type;
    }
    if (iVar14 == 2) {
      Mat::create(&local_e8,iVar15,iVar13,iVar18,1,sVar2,1,opt->workspace_allocator);
      if (((float *)local_e8.data == (float *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_0059846d;
      iVar18 = (this->super_GridSample).padding_mode;
      if (iVar18 == 3) {
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_98,&local_e8,iVar18);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_98,&local_e8,iVar18);
        }
      }
      else if (iVar18 == 2) {
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_98,&local_e8,iVar18);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_98,&local_e8,iVar18);
        }
      }
      else {
        if (iVar18 != 1) {
          forward();
          goto LAB_0059846d;
        }
        iVar18 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_98,&local_e8,iVar18);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_98,&local_e8,iVar18);
        }
      }
    }
    bVar12 = true;
    if ((this->super_GridSample).sample_type == 3) {
      forward();
      goto LAB_0059846d;
    }
  }
  iVar18 = 0;
  iVar19 = iVar18;
  if (_elempack != 1) {
    opt_00 = (Option *)(ulong)uVar1;
    iVar19 = 0;
    if (_elempack != 4) goto LAB_0059846d;
    if (uVar1 == 3) {
      iVar15 = (this->super_GridSample).sample_type;
      if (iVar15 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p4(src,this_00,&local_e8,opt_00);
        iVar19 = iVar18;
        goto LAB_0059846d;
      }
      if (iVar15 != 2) {
        if (iVar15 == 1) {
          gridsample_2d_bilinear_apply_interpolation_p4(src,this_00,&local_e8,opt_00);
          iVar19 = iVar18;
        }
        goto LAB_0059846d;
      }
    }
    else {
      iVar19 = iVar18;
      if (!bVar12) goto LAB_0059846d;
      iVar15 = (this->super_GridSample).sample_type;
      if (iVar15 != 2) {
        if (iVar15 == 1) {
          gridsample_3d_bilinear_apply_interpolation_p4(src,this_00,&local_e8,opt_00);
        }
        goto LAB_0059846d;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,&local_e8,opt_00);
    iVar19 = iVar18;
    goto LAB_0059846d;
  }
  if (uVar1 == 3) {
    iVar18 = (this->super_GridSample).sample_type;
    if (iVar18 == 3) {
      iVar18 = this_00->c;
      if (0 < (long)iVar18) {
        iVar15 = this_00->h * this_00->w;
        pvVar4 = src->data;
        sVar2 = src->elemsize;
        sVar5 = src->cstep;
        pvVar20 = this_00->data;
        sVar6 = this_00->elemsize;
        sVar7 = this_00->cstep;
        lVar21 = 0;
        do {
          if (0 < iVar15) {
            lVar16 = sVar2 * sVar5 * lVar21;
            pfVar17 = (float *)(sVar6 * sVar7 * lVar21 + (long)pvVar20);
            iVar19 = 0;
            pfVar23 = (float *)local_e8.data;
            do {
              fVar27 = *pfVar23;
              fVar25 = pfVar23[1];
              fVar29 = fVar27 + 1.0;
              fVar28 = 1.0 - fVar27;
              fVar29 = fVar29 * -6.0 + 3.0 + (3.75 - fVar29 * 0.75) * fVar29 * fVar29;
              fVar28 = (fVar28 * 1.25 + -2.25) * fVar28 * fVar28;
              fVar33 = fVar25 + 1.0;
              fVar32 = 1.0 - fVar25;
              fVar32 = (fVar32 * 1.25 + -2.25) * fVar32 * fVar32;
              fVar27 = (fVar27 * 1.25 + -2.25) * fVar27 * fVar27 + 1.0;
              lVar22 = 2;
              do {
                fVar30 = 0.0;
                fVar31 = 0.0;
                if (-1 < (long)(int)pfVar23[lVar22]) {
                  fVar31 = *(float *)((long)pvVar4 + (long)(int)pfVar23[lVar22] * 4 + lVar16);
                }
                if (-1 < (long)(int)pfVar23[lVar22 + 1]) {
                  fVar30 = *(float *)((long)pvVar4 + (long)(int)pfVar23[lVar22 + 1] * 4 + lVar16);
                }
                fVar24 = 0.0;
                fVar26 = 0.0;
                if (-1 < (long)(int)pfVar23[lVar22 + 2]) {
                  fVar26 = *(float *)((long)pvVar4 + (long)(int)pfVar23[lVar22 + 2] * 4 + lVar16);
                }
                if (-1 < (long)(int)pfVar23[lVar22 + 3]) {
                  fVar24 = *(float *)((long)pvVar4 + (long)(int)pfVar23[lVar22 + 3] * 4 + lVar16);
                }
                *(float *)(auStack_4a + lVar22) =
                     (fVar26 * (fVar28 + 1.0) + fVar31 * fVar29 + fVar30 * fVar27) -
                     fVar24 * (fVar28 + fVar27 + fVar29);
                lVar22 = lVar22 + 4;
              } while (lVar22 != 0x12);
              fVar27 = (fVar25 * 1.25 + -2.25) * fVar25 * fVar25 + 1.0;
              fVar25 = fVar33 * fVar33 * (3.75 - fVar33 * 0.75) + fVar33 * -6.0 + 3.0;
              *pfVar17 = (fVar27 * local_48[1] + fVar25 * local_48[0] +
                         (float)local_48._8_8_ * (fVar32 + 1.0)) -
                         SUB84(local_48._8_8_,4) * (fVar27 + fVar32 + fVar25);
              pfVar17 = pfVar17 + 1;
              pfVar23 = pfVar23 + 0x12;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar15);
          }
          lVar21 = lVar21 + 1;
          iVar19 = 0;
        } while (lVar21 != iVar18);
      }
      goto LAB_0059846d;
    }
    if (iVar18 != 2) {
      if ((iVar18 == 1) && (iVar18 = this_00->c, 0 < (long)iVar18)) {
        iVar15 = this_00->h * this_00->w;
        pvVar4 = src->data;
        sVar2 = src->elemsize;
        sVar5 = src->cstep;
        pvVar20 = this_00->data;
        sVar6 = this_00->elemsize;
        sVar7 = this_00->cstep;
        lVar21 = 0;
        iVar19 = 0;
        do {
          if (0 < iVar15) {
            lVar16 = sVar2 * sVar5 * lVar21;
            lVar22 = 0;
            pfVar23 = (float *)local_e8.data;
            do {
              fVar25 = 0.0;
              fVar27 = 0.0;
              if (-1 < (long)(int)*pfVar23) {
                fVar27 = *(float *)((long)pvVar4 + (long)(int)*pfVar23 * 4 + lVar16);
              }
              if (-1 < (long)(int)pfVar23[1]) {
                fVar25 = *(float *)((long)pvVar4 + (long)(int)pfVar23[1] * 4 + lVar16);
              }
              fVar29 = 0.0;
              fVar28 = 0.0;
              if (-1 < (long)(int)pfVar23[2]) {
                fVar28 = *(float *)((long)pvVar4 + (long)(int)pfVar23[2] * 4 + lVar16);
              }
              if (-1 < (long)(int)pfVar23[3]) {
                fVar29 = *(float *)((long)pvVar4 + (long)(int)pfVar23[3] * 4 + lVar16);
              }
              fVar32 = pfVar23[4];
              fVar27 = fVar32 * fVar25 + fVar27 * (1.0 - fVar32);
              *(float *)((long)pvVar20 + lVar22 * 4) =
                   ((fVar32 * fVar29 + fVar28 * (1.0 - fVar32)) - fVar27) * pfVar23[5] + fVar27;
              pfVar23 = pfVar23 + 6;
              lVar22 = lVar22 + 1;
            } while (iVar15 != (int)lVar22);
          }
          lVar21 = lVar21 + 1;
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (lVar21 != iVar18);
      }
      goto LAB_0059846d;
    }
  }
  else {
    if (!bVar12) goto LAB_0059846d;
    iVar18 = (this->super_GridSample).sample_type;
    if (iVar18 != 2) {
      if (iVar18 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p1
                  (src,this_00,&local_e8,(Option *)(ulong)_elempack);
      }
      goto LAB_0059846d;
    }
  }
  gridsample_nearest_apply_interpolation_p1(src,this_00,&local_e8,(Option *)(ulong)_elempack);
LAB_0059846d:
  piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((float *)local_e8.data != (float *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int GridSample_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}